

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::openDstFile(TSMuxer *this)

{
  AbstractOutputStream *pAVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined8 uVar4;
  ostream *poVar5;
  VodCoreException *this_00;
  File *local_1e0;
  string local_1c8;
  ostringstream local_1a8 [8];
  ostringstream ss;
  int systemFlags;
  TSMuxer *this_local;
  
  if ((this->super_AbstractMuxer).m_fileFactory == (FileFactory *)0x0) {
    local_1e0 = (File *)operator_new(0x38);
    File::File(local_1e0);
  }
  else {
    iVar2 = (*((this->super_AbstractMuxer).m_fileFactory)->_vptr_FileFactory[2])();
    local_1e0 = (File *)CONCAT44(extraout_var,iVar2);
  }
  this->m_muxFile = &local_1e0->super_AbstractOutputStream;
  pAVar1 = this->m_muxFile;
  uVar4 = std::__cxx11::string::c_str();
  uVar3 = (*(pAVar1->super_AbstractStream)._vptr_AbstractStream[2])(pAVar1,uVar4,2,0);
  if ((uVar3 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar5 = std::operator<<((ostream *)local_1a8,"Can\'t create file ");
    std::operator<<(poVar5,(string *)&this->m_outFileName);
    this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(this_00,0x67,&local_1c8);
    __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  return;
}

Assistant:

void TSMuxer::openDstFile()
{
    m_muxFile = m_fileFactory ? m_fileFactory->createFile() : new File();

    int systemFlags = 0;
#ifdef _WIN32
    if (m_owner->isAsyncMode())
        systemFlags += FILE_FLAG_NO_BUFFERING;
#endif
    if (!m_muxFile->open(m_outFileName.c_str(), File::ofWrite, systemFlags))
        THROW(ERR_CANT_CREATE_FILE, "Can't create file " << m_outFileName)
}